

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_kotlin.cpp
# Opt level: O0

string * __thiscall
flatbuffers::kotlin::KotlinGenerator::ByteBufferSetter_abi_cxx11_
          (string *__return_storage_ptr__,KotlinGenerator *this,Type *type)

{
  bool bVar1;
  BaseType *type_00;
  allocator<char> local_a9;
  string local_a8;
  allocator<char> local_81;
  string local_80;
  string local_60;
  allocator<char> local_39;
  allocator<char> local_38;
  allocator<char> local_37;
  allocator<char> local_36;
  allocator<char> local_35 [20];
  allocator<char> local_21;
  KotlinGenerator *local_20;
  Type *type_local;
  KotlinGenerator *this_local;
  
  local_20 = (KotlinGenerator *)type;
  type_local = (Type *)this;
  this_local = (KotlinGenerator *)__return_storage_ptr__;
  bVar1 = IsScalar(type->base_type);
  if (bVar1) {
    switch(*(BaseType *)&(local_20->super_BaseGenerator)._vptr_BaseGenerator) {
    case BASE_TYPE_NONE:
    case BASE_TYPE_UTYPE:
    case BASE_TYPE_BOOL:
    case BASE_TYPE_CHAR:
    case BASE_TYPE_UCHAR:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"bb.put",&local_39);
      std::allocator<char>::~allocator(&local_39);
      break;
    case BASE_TYPE_SHORT:
    case BASE_TYPE_USHORT:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"bb.putShort",local_35);
      std::allocator<char>::~allocator(local_35);
      break;
    case BASE_TYPE_INT:
    case BASE_TYPE_UINT:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"bb.putInt",&local_21);
      std::allocator<char>::~allocator(&local_21);
      break;
    case BASE_TYPE_LONG:
    case BASE_TYPE_ULONG:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"bb.putLong",&local_36);
      std::allocator<char>::~allocator(&local_36);
      break;
    case BASE_TYPE_FLOAT:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"bb.putFloat",&local_37);
      std::allocator<char>::~allocator(&local_37);
      break;
    case BASE_TYPE_DOUBLE:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"bb.putDouble",&local_38);
      std::allocator<char>::~allocator(&local_38);
      break;
    default:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"put",&local_81);
      GenTypeBasic_abi_cxx11_(&local_a8,local_20,type_00);
      Namer::Method(&local_60,&(this->namer_).super_Namer,&local_80,&local_a8);
      std::operator+(__return_storage_ptr__,"bb.",&local_60);
      std::__cxx11::string::~string((string *)&local_60);
      std::__cxx11::string::~string((string *)&local_a8);
      std::__cxx11::string::~string((string *)&local_80);
      std::allocator<char>::~allocator(&local_81);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_a9);
    std::allocator<char>::~allocator(&local_a9);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ByteBufferSetter(const Type &type) const {
    if (IsScalar(type.base_type)) {
      switch (type.base_type) {
        case BASE_TYPE_INT:
        case BASE_TYPE_UINT: return "bb.putInt";
        case BASE_TYPE_SHORT:
        case BASE_TYPE_USHORT: return "bb.putShort";
        case BASE_TYPE_ULONG:
        case BASE_TYPE_LONG: return "bb.putLong";
        case BASE_TYPE_FLOAT: return "bb.putFloat";
        case BASE_TYPE_DOUBLE: return "bb.putDouble";
        case BASE_TYPE_CHAR:
        case BASE_TYPE_UCHAR:
        case BASE_TYPE_BOOL:
        case BASE_TYPE_NONE:
        case BASE_TYPE_UTYPE: return "bb.put";
        default:
          return "bb." + namer_.Method("put", GenTypeBasic(type.base_type));
      }
    }
    return "";
  }